

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O2

void ncnn::crop_pack8_avx(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  iVar1 = dst->w;
  iVar2 = src->w;
  puVar7 = (undefined8 *)
           ((long)src->data + (long)(left << 3) * 4 + (long)top * (long)iVar2 * src->elemsize);
  puVar8 = (undefined8 *)dst->data;
  iVar9 = 0;
  iVar6 = iVar1;
  if (iVar1 < 1) {
    iVar6 = 0;
  }
  iVar10 = dst->h;
  if (dst->h < 1) {
    iVar10 = 0;
  }
  for (; iVar11 = iVar6, iVar9 != iVar10; iVar9 = iVar9 + 1) {
    while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
      uVar3 = puVar7[1];
      uVar4 = puVar7[2];
      uVar5 = puVar7[3];
      *puVar8 = *puVar7;
      puVar8[1] = uVar3;
      puVar8[2] = uVar4;
      puVar8[3] = uVar5;
      puVar7 = puVar7 + 4;
      puVar8 = puVar8 + 4;
    }
    puVar7 = (undefined8 *)((long)puVar7 + (long)((iVar2 - iVar1) * 8) * 4);
  }
  return;
}

Assistant:

static void crop_pack8_avx(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 8;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }

        ptr += (left + right) * 8;
    }
}